

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_buffer_send
                   (Curl_send_buffer **inp,connectdata *conn,curl_off_t *bytes_written,
                   size_t included_body_bytes,int socketindex)

{
  long lVar1;
  size_t size_00;
  Curl_easy *local_a8;
  Curl_easy *local_a0;
  size_t bodylen;
  size_t headlen;
  Curl_send_buffer *in;
  size_t headersize;
  Curl_easy *pCStack_70;
  curl_socket_t sockfd;
  size_t sendsize;
  HTTP *http;
  Curl_easy *data;
  size_t size;
  char *ptr;
  Curl_easy *pCStack_40;
  CURLcode result;
  ssize_t amount;
  size_t sStack_30;
  int socketindex_local;
  size_t included_body_bytes_local;
  curl_off_t *bytes_written_local;
  connectdata *conn_local;
  Curl_send_buffer **inp_local;
  
  http = (HTTP *)conn->data;
  sendsize = (size_t)(((Curl_easy *)http)->req).protop;
  headlen = (size_t)*inp;
  headersize._4_4_ = conn->sock[socketindex];
  size = (size_t)((Curl_send_buffer *)headlen)->buffer;
  data = (Curl_easy *)((Curl_send_buffer *)headlen)->size_used;
  in = (Curl_send_buffer *)((long)data - included_body_bytes);
  ptr._4_4_ = CURLE_OK;
  pCStack_70 = data;
  amount._4_4_ = socketindex;
  sStack_30 = included_body_bytes;
  included_body_bytes_local = (size_t)bytes_written;
  bytes_written_local = (curl_off_t *)conn;
  conn_local = (connectdata *)inp;
  if ((((conn->handler->flags & 1) != 0) || ((conn->http_proxy).proxytype == CURLPROXY_HTTPS)) &&
     (conn->httpversion != 0x14)) {
    local_a0 = data;
    if ((Curl_easy *)0x3fff < data) {
      local_a0 = (Curl_easy *)0x4000;
    }
    pCStack_70 = local_a0;
    ptr._4_4_ = Curl_get_upload_buffer((Curl_easy *)http);
    if (ptr._4_4_ != CURLE_OK) {
      Curl_add_buffer_free((Curl_send_buffer **)&headlen);
      return ptr._4_4_;
    }
    memcpy(http[8].form.fp,(void *)size,(size_t)pCStack_70);
    size = (size_t)http[8].form.fp;
  }
  ptr._4_4_ = Curl_write((connectdata *)bytes_written_local,headersize._4_4_,(void *)size,
                         (size_t)pCStack_70,(ssize_t *)&stack0xffffffffffffffc0);
  if (ptr._4_4_ == CURLE_OK) {
    if (in < pCStack_40) {
      local_a8 = (Curl_easy *)in;
    }
    else {
      local_a8 = pCStack_40;
    }
    size_00 = (long)pCStack_40 - (long)local_a8;
    if ((((ulong)http[7].form.filename >> 0x1e & 1) != 0) &&
       (Curl_debug((Curl_easy *)http,CURLINFO_HEADER_OUT,(char *)size,(size_t)local_a8),
       size_00 != 0)) {
      Curl_debug((Curl_easy *)http,CURLINFO_DATA_OUT,
                 (char *)((long)local_a8->sockets + (size - 0x80)),size_00);
    }
    *(long *)included_body_bytes_local =
         (long)pCStack_40->sockets + *(long *)included_body_bytes_local + -0x80;
    if (sendsize == 0) {
      if (pCStack_40 != data) {
        return CURLE_SEND_ERROR;
      }
    }
    else {
      *(size_t *)((http->form).encstate.buf + 8) =
           size_00 + *(long *)((http->form).encstate.buf + 8);
      Curl_pgrsSetUploadCounter((Curl_easy *)http,*(curl_off_t *)((http->form).encstate.buf + 8));
      if (pCStack_40 != data) {
        lVar1 = *(long *)headlen;
        *(curl_off_t *)(sendsize + 0x1e8) = http[10].form.datasize;
        *(undefined8 *)(sendsize + 0x1f0) = *(undefined8 *)&http[10].form.flags;
        *(undefined8 *)(sendsize + 0x1f8) = *(undefined8 *)(sendsize + 0x10);
        *(undefined8 *)(sendsize + 0x200) = *(undefined8 *)(sendsize + 8);
        http[10].form.datasize = (curl_off_t)readmoredata;
        *(curl_off_t **)&http[10].form.flags = bytes_written_local;
        *(long *)(sendsize + 0x10) = (long)pCStack_40->sockets + lVar1 + -0x80;
        *(long *)(sendsize + 8) = (long)data - (long)pCStack_40;
        *(size_t *)(sendsize + 0x210) = headlen;
        *(undefined4 *)(sendsize + 0x208) = 1;
        return CURLE_OK;
      }
      *(undefined4 *)(sendsize + 0x208) = 2;
    }
  }
  Curl_add_buffer_free((Curl_send_buffer **)&headlen);
  return ptr._4_4_;
}

Assistant:

CURLcode Curl_add_buffer_send(Curl_send_buffer **inp,
                              struct connectdata *conn,

                              /* add the number of sent bytes to this
                                 counter */
                              curl_off_t *bytes_written,

                              /* how much of the buffer contains body data */
                              size_t included_body_bytes,
                              int socketindex)
{
  ssize_t amount;
  CURLcode result;
  char *ptr;
  size_t size;
  struct Curl_easy *data = conn->data;
  struct HTTP *http = data->req.protop;
  size_t sendsize;
  curl_socket_t sockfd;
  size_t headersize;
  Curl_send_buffer *in = *inp;

  DEBUGASSERT(socketindex <= SECONDARYSOCKET);

  sockfd = conn->sock[socketindex];

  /* The looping below is required since we use non-blocking sockets, but due
     to the circumstances we will just loop and try again and again etc */

  ptr = in->buffer;
  size = in->size_used;

  headersize = size - included_body_bytes; /* the initial part that isn't body
                                              is header */

  DEBUGASSERT(size > included_body_bytes);

  result = Curl_convert_to_network(data, ptr, headersize);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(result) {
    /* conversion failed, free memory and return to the caller */
    Curl_add_buffer_free(inp);
    return result;
  }

  if((conn->handler->flags & PROTOPT_SSL ||
     conn->http_proxy.proxytype == CURLPROXY_HTTPS)
     && conn->httpversion != 20) {
    /* We never send more than CURL_MAX_WRITE_SIZE bytes in one single chunk
       when we speak HTTPS, as if only a fraction of it is sent now, this data
       needs to fit into the normal read-callback buffer later on and that
       buffer is using this size.
    */

    sendsize = CURLMIN(size, CURL_MAX_WRITE_SIZE);

    /* OpenSSL is very picky and we must send the SAME buffer pointer to the
       library when we attempt to re-send this buffer. Sending the same data
       is not enough, we must use the exact same address. For this reason, we
       must copy the data to the uploadbuffer first, since that is the buffer
       we will be using if this send is retried later.
    */
    result = Curl_get_upload_buffer(data);
    if(result) {
      /* malloc failed, free memory and return to the caller */
      Curl_add_buffer_free(&in);
      return result;
    }
    memcpy(data->state.ulbuf, ptr, sendsize);
    ptr = data->state.ulbuf;
  }
  else
    sendsize = size;

  result = Curl_write(conn, sockfd, ptr, sendsize, &amount);

  if(!result) {
    /*
     * Note that we may not send the entire chunk at once, and we have a set
     * number of data bytes at the end of the big buffer (out of which we may
     * only send away a part).
     */
    /* how much of the header that was sent */
    size_t headlen = (size_t)amount>headersize ? headersize : (size_t)amount;
    size_t bodylen = amount - headlen;

    if(data->set.verbose) {
      /* this data _may_ contain binary stuff */
      Curl_debug(data, CURLINFO_HEADER_OUT, ptr, headlen);
      if(bodylen) {
        /* there was body data sent beyond the initial header part, pass that
           on to the debug callback too */
        Curl_debug(data, CURLINFO_DATA_OUT,
                   ptr + headlen, bodylen);
      }
    }

    /* 'amount' can never be a very large value here so typecasting it so a
       signed 31 bit value should not cause problems even if ssize_t is
       64bit */
    *bytes_written += (long)amount;

    if(http) {
      /* if we sent a piece of the body here, up the byte counter for it
         accordingly */
      data->req.writebytecount += bodylen;
      Curl_pgrsSetUploadCounter(data, data->req.writebytecount);

      if((size_t)amount != size) {
        /* The whole request could not be sent in one system call. We must
           queue it up and send it later when we get the chance. We must not
           loop here and wait until it might work again. */

        size -= amount;

        ptr = in->buffer + amount;

        /* backup the currently set pointers */
        http->backup.fread_func = data->state.fread_func;
        http->backup.fread_in = data->state.in;
        http->backup.postdata = http->postdata;
        http->backup.postsize = http->postsize;

        /* set the new pointers for the request-sending */
        data->state.fread_func = (curl_read_callback)readmoredata;
        data->state.in = (void *)conn;
        http->postdata = ptr;
        http->postsize = (curl_off_t)size;

        http->send_buffer = in;
        http->sending = HTTPSEND_REQUEST;

        return CURLE_OK;
      }
      http->sending = HTTPSEND_BODY;
      /* the full buffer was sent, clean up and return */
    }
    else {
      if((size_t)amount != size)
        /* We have no continue-send mechanism now, fail. This can only happen
           when this function is used from the CONNECT sending function. We
           currently (stupidly) assume that the whole request is always sent
           away in the first single chunk.

           This needs FIXing.
        */
        return CURLE_SEND_ERROR;
    }
  }
  Curl_add_buffer_free(&in);

  return result;
}